

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void do_cmd_stash(command *cmd)

{
  loc grid;
  _Bool _Var1;
  char cVar2;
  wchar_t wVar3;
  store *store;
  object *obj_00;
  char *fmt;
  _Bool none_left;
  object *obj;
  wchar_t amt;
  char o_name [120];
  object dummy;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  store = store_at((chunk *)cave,grid);
  none_left = false;
  wVar3 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if (wVar3 != L'\0') {
    return;
  }
  wVar3 = cmd_get_quantity((command_conflict *)cmd,"quantity",&amt,(uint)obj->number);
  if (wVar3 == L'\0') {
    if (store->sidx == store_home_idx) {
      _Var1 = object_is_equipped(player->body,obj);
      if ((!_Var1) || (_Var1 = obj_can_takeoff(obj), _Var1)) {
        object_copy_amt(&dummy,obj,amt);
        _Var1 = store_check_num(store,&dummy);
        object_wipe(&dummy);
        if (_Var1) {
          cVar2 = gear_to_label(player,obj);
          obj_00 = gear_object_for_use(player,obj,amt,false,&none_left);
          object_desc(o_name,0x78,obj_00,0x43,player);
          msg("You drop %s (%c).",o_name,(ulong)(uint)(int)cVar2);
          handle_stuff(player);
          home_carry(obj_00);
          event_signal(EVENT_STORECHANGED);
          event_signal(EVENT_INVENTORY);
          event_signal(EVENT_EQUIPMENT);
          return;
        }
        fmt = "Your home is full.";
      }
      else {
        fmt = "Hmmm, it seems to be stuck.";
      }
    }
    else {
      fmt = "You are not in your home.";
    }
    msg(fmt);
    return;
  }
  return;
}

Assistant:

void do_cmd_stash(struct command *cmd)
{
	int amt;
	struct object dummy;
	struct store *store = store_at(cave, player->grid);
	char o_name[120];
	char label;

	struct object *obj, *dropped;
	bool none_left = false;
	bool no_room;

	if (cmd_get_arg_item(cmd, "item", &obj))
		return;

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	/* Check we are somewhere we can stash items. */
	if (!store_is_home(store)) {
		msg("You are not in your home.");
		return;
	}

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}	

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(&dummy, obj, amt);

	no_room = !store_check_num(store, &dummy);
	/*
	 * Do not need the dummy any more so release the memory allocated
	 * within it.
	 */
	object_wipe(&dummy);
	if (no_room) {
		msg("Your home is full.");
		return;
	}

	/* Get where the object is now */
	label = gear_to_label(player, obj);

	/* Now get the real item */
	dropped = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Describe */
	object_desc(o_name, sizeof(o_name), dropped,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Message */
	msg("You drop %s (%c).", o_name, label);

	/* Handle stuff */
	handle_stuff(player);

	/* Let the home carry it */
	home_carry(dropped);

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}